

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O3

void __thiscall Storage::Disk::Drive::set_disk(Drive *this,shared_ptr<Storage::Disk::Disk> *disk)

{
  element_type *peVar1;
  Observer *pOVar2;
  uint uVar3;
  
  if (this->ready_type_ - ShugartModifiedRDY < 2) {
    this->is_ready_ = false;
  }
  peVar1 = (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Disk[6])(peVar1);
  }
  (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (disk->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(disk->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this->has_disk_ =
       (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0;
  invalidate_track(this);
  (*(this->super_Source)._vptr_Source[4])(this,(ulong)(peVar1 != (element_type *)0x0));
  pOVar2 = (this->super_Source).observer_;
  if (pOVar2 != (Observer *)0x0) {
    uVar3 = (**(this->super_Source)._vptr_Source)(this);
    (**pOVar2->_vptr_Observer)(pOVar2,this,(ulong)uVar3,*pOVar2->_vptr_Observer);
    return;
  }
  return;
}

Assistant:

void Drive::set_disk(const std::shared_ptr<Disk> &disk) {
	if(ready_type_ == ReadyType::ShugartModifiedRDY || ready_type_ == ReadyType::IBMRDY) {
		is_ready_ = false;
	}
	const bool had_disk = bool(disk_);
	if(disk_) disk_->flush_tracks();
	disk_ = disk;
	has_disk_ = !!disk_;

	invalidate_track();
	did_set_disk(had_disk);
	update_clocking_observer();
}